

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

void __thiscall Node::OutputClose(Node *this,ostream *os)

{
  ostream *poVar1;
  int iVar2;
  string local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  iVar2 = this->Type;
  while (iVar2 == 0x1f5) {
    OutputClose(this->Tree[0],os);
    this = this->Tree[1];
    iVar2 = this->Type;
  }
  iVar2 = 0;
  if (0 < Level) {
    iVar2 = Level;
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)iVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_40,local_38);
  GetIPChannel_abi_cxx11_(&local_60,this,0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".close();",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void Node::OutputClose(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:
		Tree[0]->OutputClose(os);
		Tree[1]->OutputClose(os);
		break;

	default:
		os << Indent() <<
			GetIPChannel(this, 0) <<
			".close();" << std::endl;
		break;
	}
}